

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::GetCollection(Prim *prim,Collection **dst)

{
  function<bool_(const_tinyusdz::Collection_*)> local_50;
  anon_class_8_1_ba1d4125 aStack_28;
  bool ret;
  anon_class_8_1_ba1d4125 fn;
  Collection **dst_local;
  Prim *prim_local;
  
  if (dst == (Collection **)0x0) {
    prim_local._7_1_ = false;
  }
  else {
    aStack_28.dst = dst;
    fn.dst = dst;
    ::std::function<bool(tinyusdz::Collection_const*)>::
    function<tinyusdz::tydra::GetCollection(tinyusdz::Prim_const&,tinyusdz::Collection_const**)::__0&,void>
              ((function<bool(tinyusdz::Collection_const*)> *)&local_50,&stack0xffffffffffffffd8);
    prim_local._7_1_ = ApplyToCollection(prim,&local_50);
    ::std::function<bool_(const_tinyusdz::Collection_*)>::~function(&local_50);
  }
  return prim_local._7_1_;
}

Assistant:

bool GetCollection(const Prim &prim, const Collection **dst) {
  if (!dst) {
    return false;
  }

  auto fn = [dst](const Collection *coll) {
    (*dst) = coll;
    return true;
  };

  bool ret = ApplyToCollection(prim, fn);

  return ret;
}